

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void process_pending_handles(Curl_multi *multi)

{
  curl_llist_element *e_00;
  Curl_easy *data_00;
  Curl_easy *data;
  curl_llist_element *e;
  Curl_multi *multi_local;
  
  e_00 = (multi->pending).head;
  if (e_00 != (curl_llist_element *)0x0) {
    data_00 = (Curl_easy *)e_00->ptr;
    mstate(data_00,CURLM_STATE_CONNECT);
    Curl_llist_remove(&multi->pending,e_00,(void *)0x0);
    Curl_expire(data_00,0,EXPIRE_RUN_NOW);
    *(ushort *)&(data_00->state).field_0x4e4 =
         *(ushort *)&(data_00->state).field_0x4e4 & 0xdfff | 0x2000;
  }
  return;
}

Assistant:

static void process_pending_handles(struct Curl_multi *multi)
{
  struct curl_llist_element *e = multi->pending.head;
  if(e) {
    struct Curl_easy *data = e->ptr;

    DEBUGASSERT(data->mstate == CURLM_STATE_CONNECT_PEND);

    multistate(data, CURLM_STATE_CONNECT);

    /* Remove this node from the list */
    Curl_llist_remove(&multi->pending, e, NULL);

    /* Make sure that the handle will be processed soonish. */
    Curl_expire(data, 0, EXPIRE_RUN_NOW);

    /* mark this as having been in the pending queue */
    data->state.previouslypending = TRUE;
  }
}